

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupOntop(Gia_Man_t *p,Gia_Man_t *p2)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *pGVar6;
  int iVar7;
  
  if (p->vCos->nSize - p->nRegs != p2->vCis->nSize - p2->nRegs) {
    __assert_fail("Gia_ManPoNum(p) == Gia_ManPiNum(p2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x90b,"Gia_Man_t *Gia_ManDupOntop(Gia_Man_t *, Gia_Man_t *)");
  }
  if (p->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x90c,"Gia_Man_t *Gia_ManDupOntop(Gia_Man_t *, Gia_Man_t *)");
  }
  if (p2->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p2) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                  ,0x90d,"Gia_Man_t *Gia_ManDupOntop(Gia_Man_t *, Gia_Man_t *)");
  }
  p_00 = Gia_ManStart(p2->nObjs + p->nObjs);
  pcVar4 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar4;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  for (iVar7 = 0; iVar7 < p->vCis->nSize; iVar7 = iVar7 + 1) {
    pGVar5 = Gia_ManCi(p,iVar7);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ManAppendCi(p_00);
    pGVar5->Value = uVar1;
  }
  for (iVar7 = 0; iVar7 < p->nObjs; iVar7 = iVar7 + 1) {
    pGVar5 = Gia_ManObj(p,iVar7);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar5) {
      iVar2 = Gia_ObjFanin0Copy(pGVar5);
      iVar3 = Gia_ObjFanin1Copy(pGVar5);
      uVar1 = Gia_ManHashAnd(p_00,iVar2,iVar3);
      pGVar5->Value = uVar1;
    }
  }
  p2->pObjs->Value = 0;
  for (iVar7 = 0; iVar7 < p->vCos->nSize; iVar7 = iVar7 + 1) {
    pGVar5 = Gia_ManCo(p,iVar7);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ObjFanin0Copy(pGVar5);
    pGVar5 = Gia_ManPi(p2,iVar7);
    pGVar5->Value = uVar1;
  }
  for (iVar7 = 0; iVar7 < p2->nObjs; iVar7 = iVar7 + 1) {
    pGVar5 = Gia_ManObj(p2,iVar7);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar5) {
      iVar2 = Gia_ObjFanin0Copy(pGVar5);
      iVar3 = Gia_ObjFanin1Copy(pGVar5);
      uVar1 = Gia_ManHashAnd(p_00,iVar2,iVar3);
      pGVar5->Value = uVar1;
    }
  }
  for (iVar7 = 0; iVar7 < p2->vCos->nSize; iVar7 = iVar7 + 1) {
    pGVar5 = Gia_ManCo(p2,iVar7);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjFanin0Copy(pGVar5);
    uVar1 = Gia_ManAppendCo(p_00,iVar2);
    pGVar5->Value = uVar1;
  }
  Gia_ManHashStop(p_00);
  pGVar6 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_ManDupOntop( Gia_Man_t * p, Gia_Man_t * p2 )
{
    Gia_Man_t * pTemp, * pNew;
    Gia_Obj_t * pObj;
    int i;
    assert( Gia_ManPoNum(p) == Gia_ManPiNum(p2) );
    assert( Gia_ManRegNum(p) == 0 );
    assert( Gia_ManRegNum(p2) == 0 );
    pNew = Gia_ManStart( Gia_ManObjNum(p)+Gia_ManObjNum(p2) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    // dup first AIG
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // dup second AIG
    Gia_ManConst0(p2)->Value = 0;
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManPi(p2, i)->Value = Gia_ObjFanin0Copy(pObj);
    Gia_ManForEachAnd( p2, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachCo( p2, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
//    Gia_ManPrintStats( pGiaNew, 0 );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}